

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_list.h
# Opt level: O0

void lu_list_add(lu_int elem,lu_int list,lu_int *flink,lu_int *blink,lu_int nelem,lu_int *min_list)

{
  int iVar1;
  lu_int temp;
  lu_int *min_list_local;
  lu_int nelem_local;
  lu_int *blink_local;
  lu_int *flink_local;
  lu_int list_local;
  lu_int elem_local;
  
  iVar1 = blink[nelem + list];
  blink[nelem + list] = elem;
  blink[elem] = iVar1;
  flink[iVar1] = elem;
  flink[elem] = nelem + list;
  if (((0 < list) && (min_list != (lu_int *)0x0)) && (list < *min_list)) {
    *min_list = list;
  }
  return;
}

Assistant:

static inline void lu_list_add(
    lu_int elem, lu_int list, lu_int *flink, lu_int *blink, lu_int nelem,
    lu_int *min_list)
{
    lu_int temp;
    assert(flink[elem] == elem);
    assert(blink[elem] == elem);
    /* append elem to the end of list */
    temp = blink[nelem+list];
    blink[nelem+list] = elem;
    blink[elem] = temp;
    flink[temp] = elem;
    flink[elem] = nelem+list;
    if (list > 0 && min_list && list < *min_list)
        *min_list = list;
}